

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O3

err_t cmdCVCsCreate(octet *certs,size_t *certs_len,char *descr)

{
  err_t eVar1;
  err_t eVar2;
  long lVar3;
  size_t sVar4;
  int argc;
  char **argv;
  size_t size;
  int local_44;
  char **local_40;
  size_t local_38;
  
  eVar1 = cmdArgCreate(&local_44,&local_40,descr);
  if (eVar1 == 0) {
    eVar1 = 0;
    if (local_44 < 1) {
      sVar4 = 0;
    }
    else {
      lVar3 = 0;
      sVar4 = 0;
      do {
        local_38 = cmdFileSize(local_40[lVar3]);
        if (local_38 == 0xffffffffffffffff) {
          eVar2 = 0xcf;
          goto LAB_0010385b;
        }
        if (certs != (octet *)0x0) {
          if (*certs_len < local_38 + sVar4) {
            eVar2 = 0x6e;
LAB_0010385b:
            cmdArgClose(local_40);
            return eVar2;
          }
          eVar2 = cmdFileReadAll(certs + sVar4,&local_38,local_40[lVar3]);
          if (eVar2 != 0) goto LAB_0010385b;
        }
        sVar4 = sVar4 + local_38;
        lVar3 = lVar3 + 1;
      } while (lVar3 < local_44);
    }
    cmdArgClose(local_40);
    *certs_len = sVar4;
  }
  return eVar1;
}

Assistant:

err_t cmdCVCsCreate(octet* certs, size_t* certs_len, const char* descr)
{
	err_t code;
	int argc;
	char** argv;
	int pos;
	size_t len;
	// pre
	ASSERT(memIsValid(certs_len, O_PER_S));
	ASSERT(memIsNullOrValid(certs, *certs_len));
	ASSERT(strIsValid(descr));
	// создать список файлов сертификатов
	code = cmdArgCreate(&argc, &argv, descr);
	ERR_CALL_CHECK(code);
	// просмотреть список
	len = 0;
	for (pos = 0; pos < argc; ++pos)
	{
		size_t size;
		// определить размер файла
		size = cmdFileSize(argv[pos]);
		code = size != SIZE_MAX ? ERR_OK : ERR_FILE_READ;
		ERR_CALL_HANDLE(code, cmdArgClose(argv));
		// режим чтения?
		if (certs)
		{
			// выход за границы?
			code = len + size <= *certs_len ? ERR_OK : ERR_OUTOFMEMORY;
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
			// читать сертификат
			code = cmdFileReadAll(certs + len, &size, argv[pos]);
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
		}
		// увеличить длину коллекции
		len += size;
	}
	cmdArgClose(argv);
	// завершить
	*certs_len = len;
	return code;
}